

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

expected<const_Command::Arg_*,_Commands::MatchFailure> *
match_arg(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
         Commands *commands,shared_ptr<const_SyntaxTree> *hint,float arg,Arg *arginfo,
         SymTable *symtable,shared_ptr<Scope> *scope_ptr,Options *options)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ArgType AVar2;
  expected<const_Command::Arg_*,_Commands::MatchFailure> *in_RAX;
  expected<const_Command::Arg_*,_Commands::MatchFailure> *peVar3;
  expected<const_Command::Arg_*,_Commands::MatchFailure> *extraout_RAX;
  
  if ((arginfo->field_0x1 & 8) != 0) {
    AVar2 = arginfo->type;
    if ((AVar2 != Float) && (AVar2 != Param)) {
      peVar3 = make_expected_error(__return_storage_ptr__,(shared_ptr<const_SyntaxTree> *)commands,
                                   (Arg *)hint);
      return peVar3;
    }
    __return_storage_ptr__->has_value = true;
    (__return_storage_ptr__->contained).m_value = arginfo;
    return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)(ulong)AVar2;
  }
  if (hint == (shared_ptr<const_SyntaxTree> *)0x0) {
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)commands;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->contained).m_error.reason = LiteralValueDisallowed;
    return in_RAX;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1 = &(hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    UNLOCK();
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
      ;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
      goto LAB_0016347d;
    }
  }
  else {
    p_Var1 = &(hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
  }
  p_Var1 = &(hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
LAB_0016347d:
  __return_storage_ptr__->has_value = false;
  (__return_storage_ptr__->contained).m_value = (value_type)commands;
  (__return_storage_ptr__->contained).m_error.context.
  super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hint;
  (__return_storage_ptr__->contained).m_error.reason = LiteralValueDisallowed;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hint);
  return extraout_RAX;
}

Assistant:

static auto match_arg(const Commands& commands, const shared_ptr<const SyntaxTree>& hint,
                      float arg, const Command::Arg& arginfo, const SymTable& symtable,
                      const shared_ptr<Scope>& scope_ptr, const Options& options) -> expected<const Command::Arg*, MatchFailure>
{
    if(!arginfo.allow_constant)
        return make_unexpected(MatchFailure{ hint, MatchFailure::LiteralValueDisallowed });
    if(arginfo.type == ArgType::Float || arginfo.type == ArgType::Param)
        return &arginfo;
    return make_expected_error(hint, arginfo);
}